

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O0

int Abc_CommandAbSec(Abc_Frame_t *pAbc,int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  uint local_60;
  int c;
  int fVerbose;
  int nFrames;
  int fMiter;
  int nArgcNew;
  char **pArgvNew;
  int fDelete2;
  int fDelete1;
  Abc_Ntk_t *pNtk2;
  Abc_Ntk_t *pNtk1;
  Abc_Ntk_t *pNtk;
  char **argv_local;
  Abc_Frame_t *pAStack_18;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  pNtk = (Abc_Ntk_t *)argv;
  argv_local._4_4_ = argc;
  pAStack_18 = pAbc;
  pNtk1 = Abc_FrameReadNtk(pAbc);
  bVar1 = true;
  c = 2;
  local_60 = 0;
  Extra_UtilGetoptReset();
  while( true ) {
    while( true ) {
      iVar2 = Extra_UtilGetopt(argv_local._4_4_,(char **)pNtk,"Fmvh");
      if (iVar2 == -1) {
        if (bVar1) {
          if (argv_local._4_4_ == globalUtilOptind + 1) {
            Abc_Print(-1,"The miter cannot be given on the command line. Use \"read\".\n");
            return 0;
          }
          iVar2 = Abc_NtkIsStrash(pNtk1);
          if (iVar2 == 0) {
            Abc_Print(-1,"The miter should be structurally hashed. Use \"st\"\n");
            return 0;
          }
          iVar2 = Abc_NtkDarAbSec(pNtk1,(Abc_Ntk_t *)0x0,c,local_60);
          if (iVar2 == 1) {
            pAStack_18->Status = 1;
          }
          else {
            pAStack_18->Status = -1;
          }
        }
        else {
          iVar2 = Abc_NtkPrepareTwoNtks
                            (_stdout,pNtk1,
                             (char **)(pNtk->nObjCounts + (long)globalUtilOptind * 2 + -0x18),
                             argv_local._4_4_ - globalUtilOptind,&pNtk2,(Abc_Ntk_t **)&fDelete2,
                             (int *)((long)&pArgvNew + 4),(int *)&pArgvNew);
          if (iVar2 == 0) {
            return 1;
          }
          iVar2 = Abc_NtkLatchNum(pNtk2);
          if ((iVar2 == 0) || (iVar2 = Abc_NtkLatchNum(_fDelete2), iVar2 == 0)) {
            if (pArgvNew._4_4_ != 0) {
              Abc_NtkDelete(pNtk2);
            }
            if ((int)pArgvNew != 0) {
              Abc_NtkDelete(_fDelete2);
            }
            Abc_Print(-1,"The network has no latches. Used combinational command \"cec\".\n");
            return 0;
          }
          iVar2 = Abc_NtkDarAbSec(pNtk2,_fDelete2,c,local_60);
          if (iVar2 == 1) {
            pAStack_18->Status = 1;
          }
          else {
            pAStack_18->Status = -1;
          }
          if (pArgvNew._4_4_ != 0) {
            Abc_NtkDelete(pNtk2);
          }
          if ((int)pArgvNew != 0) {
            Abc_NtkDelete(_fDelete2);
          }
        }
        return 0;
      }
      if (iVar2 == 0x46) break;
      if (iVar2 == 0x6d) {
        bVar1 = (bool)(bVar1 ^ 1);
      }
      else {
        if (iVar2 != 0x76) goto LAB_0024d169;
        local_60 = local_60 ^ 1;
      }
    }
    if (argv_local._4_4_ <= globalUtilOptind) break;
    c = atoi(*(char **)(pNtk->nObjCounts + (long)globalUtilOptind * 2 + -0x18));
    globalUtilOptind = globalUtilOptind + 1;
    if (c < 0) {
LAB_0024d169:
      Abc_Print(-2,"usage: absec [-F num] [-mv] <file1> <file2>\n");
      Abc_Print(-2,"\t         performs SEC by applying CEC to several timeframes\n");
      Abc_Print(-2,"\t-F num : the total number of timeframes to use [default = %d]\n",
                (ulong)(uint)c);
      pcVar3 = "two networks";
      if (bVar1) {
        pcVar3 = "miter";
      }
      Abc_Print(-2,"\t-m     : toggles miter vs. two networks [default = %s]\n",pcVar3);
      pcVar3 = "no";
      if (local_60 != 0) {
        pcVar3 = "yes";
      }
      Abc_Print(-2,"\t-v     : toggles verbose output [default = %s]\n",pcVar3);
      Abc_Print(-2,"\tfile1  : (optional) the file with the first network\n");
      Abc_Print(-2,"\tfile2  : (optional) the file with the second network\n");
      Abc_Print(-2,"\t         if no files are given, uses the current network and its spec\n");
      Abc_Print(-2,"\t         if one file is given, uses the current network and the file\n");
      return 1;
    }
  }
  Abc_Print(-1,"Command line switch \"-F\" should be followed by an integer.\n");
  goto LAB_0024d169;
}

Assistant:

int Abc_CommandAbSec( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Abc_Ntk_t * pNtk, * pNtk1, * pNtk2;
    int fDelete1, fDelete2;
    char ** pArgvNew;
    int nArgcNew;
    int fMiter, nFrames, fVerbose, c;

    extern int Abc_NtkDarAbSec( Abc_Ntk_t * pNtk1, Abc_Ntk_t * pNtk2, int nFrames, int fVerbose );

    pNtk = Abc_FrameReadNtk(pAbc);
    // set defaults
    fMiter   = 1;
    nFrames  = 2;
    fVerbose = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "Fmvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'F':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-F\" should be followed by an integer.\n" );
                goto usage;
            }
            nFrames = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nFrames < 0 )
                goto usage;
            break;
        case 'm':
            fMiter ^= 1;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        default:
            goto usage;
        }
    }

    if ( fMiter )
    {
//        pNtk = Io_Read( argv[globalUtilOptind], Io_ReadFileType(argv[globalUtilOptind]), 1, 0 );
        if ( argc == globalUtilOptind + 1 )
        {
            Abc_Print( -1, "The miter cannot be given on the command line. Use \"read\".\n" );
            return 0;
        }
        if ( !Abc_NtkIsStrash(pNtk) )
        {
            Abc_Print( -1, "The miter should be structurally hashed. Use \"st\"\n" );
            return 0;
        }
        if ( Abc_NtkDarAbSec( pNtk, NULL, nFrames, fVerbose ) == 1 )
            pAbc->Status = 1;
        else
            pAbc->Status = -1;
    }
    else
    {
        pArgvNew = argv + globalUtilOptind;
        nArgcNew = argc - globalUtilOptind;
        if ( !Abc_NtkPrepareTwoNtks( stdout, pNtk, pArgvNew, nArgcNew, &pNtk1, &pNtk2, &fDelete1, &fDelete2 ) )
            return 1;
        if ( Abc_NtkLatchNum(pNtk1) == 0 || Abc_NtkLatchNum(pNtk2) == 0 )
        {
            if ( fDelete1 ) Abc_NtkDelete( pNtk1 );
            if ( fDelete2 ) Abc_NtkDelete( pNtk2 );
            Abc_Print( -1, "The network has no latches. Used combinational command \"cec\".\n" );
            return 0;
        }
        // perform verification
        if ( Abc_NtkDarAbSec( pNtk1, pNtk2, nFrames, fVerbose ) == 1 )
            pAbc->Status = 1;
        else
            pAbc->Status = -1;
        if ( fDelete1 ) Abc_NtkDelete( pNtk1 );
        if ( fDelete2 ) Abc_NtkDelete( pNtk2 );
    }
    return 0;

usage:
    Abc_Print( -2, "usage: absec [-F num] [-mv] <file1> <file2>\n" );
    Abc_Print( -2, "\t         performs SEC by applying CEC to several timeframes\n" );
    Abc_Print( -2, "\t-F num : the total number of timeframes to use [default = %d]\n", nFrames );
    Abc_Print( -2, "\t-m     : toggles miter vs. two networks [default = %s]\n", fMiter? "miter": "two networks" );
    Abc_Print( -2, "\t-v     : toggles verbose output [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\tfile1  : (optional) the file with the first network\n");
    Abc_Print( -2, "\tfile2  : (optional) the file with the second network\n");
    Abc_Print( -2, "\t         if no files are given, uses the current network and its spec\n");
    Abc_Print( -2, "\t         if one file is given, uses the current network and the file\n");
    return 1;
}